

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O3

Vec_Ptr_t * Sim_ComputeFunSupp(Abc_Ntk_t *pNtk,int fVerbose)

{
  long lVar1;
  undefined4 uVar2;
  uint *puVar3;
  long *plVar4;
  void **ppvVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  Sim_Man_t *p;
  void **ppvVar10;
  void *pvVar11;
  Fraig_Man_t *p_00;
  int *__s;
  Vec_Ptr_t *pVVar12;
  Sim_Pat_t *pSVar13;
  int i;
  Vec_Int_t *vDiffs;
  Vec_Vec_t *pVVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  Abc_Ntk_t *pAVar22;
  int iVar23;
  long lVar24;
  timespec ts_1;
  timespec ts;
  timespec local_b0;
  Abc_Ntk_t *local_a0;
  void **local_98;
  size_t local_90;
  ulong local_88;
  long local_80;
  Sim_Pat_t *local_78;
  Fraig_Params_t local_70;
  
  iVar6 = clock_gettime(3,(timespec *)&local_70);
  if (iVar6 < 0) {
    local_80 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                    SEXT816(CONCAT44(local_70.nSeconds,local_70.nBTLimit)),8);
    local_80 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_70._0_8_ * -1000000;
  }
  srand(0xabc);
  p = Sim_ManStart(pNtk,0);
  Sim_UtilAssignRandom(p);
  Sim_ComputeSuppRound(p,0);
  pVVar12 = p->pNtk->vCos;
  if (0 < pVVar12->nSize) {
    vDiffs = p->vDiffs;
    lVar16 = 0;
    do {
      Sim_UtilInfoDetectNews
                ((uint *)p->vSuppFun->pArray[lVar16],
                 (uint *)p->vSuppStr->pArray[*(int *)((long)pVVar12->pArray[lVar16] + 0x10)],
                 p->nSuppWords,vDiffs);
      vDiffs = p->vDiffs;
      if (0 < vDiffs->nSize) {
        lVar24 = 0;
        do {
          uVar8 = vDiffs->pArray[lVar24];
          pVVar14 = p->vSuppTargs;
          iVar6 = pVVar14->nSize;
          iVar7 = iVar6;
          if (iVar6 <= (int)uVar8) {
            iVar7 = uVar8 + 1;
            if (pVVar14->nCap <= (int)uVar8) {
              if (pVVar14->pArray == (void **)0x0) {
                ppvVar10 = (void **)malloc((long)iVar7 << 3);
              }
              else {
                ppvVar10 = (void **)realloc(pVVar14->pArray,(long)iVar7 << 3);
                iVar6 = pVVar14->nSize;
              }
              pVVar14->pArray = ppvVar10;
              pVVar14->nCap = iVar7;
            }
            if (iVar6 <= (int)uVar8) {
              lVar19 = (long)iVar6;
              iVar6 = (uVar8 - iVar6) + 1;
              do {
                pvVar11 = calloc(1,0x10);
                pVVar14->pArray[lVar19] = pvVar11;
                lVar19 = lVar19 + 1;
                iVar6 = iVar6 + -1;
              } while (iVar6 != 0);
            }
            pVVar14->nSize = iVar7;
          }
          if (((int)uVar8 < 0) || (iVar7 <= (int)uVar8)) {
LAB_004d366a:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                          ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
          }
          puVar3 = (uint *)pVVar14->pArray[uVar8];
          uVar8 = puVar3[1];
          if (uVar8 == *puVar3) {
            if ((int)uVar8 < 0x10) {
              if (*(void **)(puVar3 + 2) == (void *)0x0) {
                pvVar11 = malloc(0x80);
              }
              else {
                pvVar11 = realloc(*(void **)(puVar3 + 2),0x80);
              }
              *(void **)(puVar3 + 2) = pvVar11;
              *puVar3 = 0x10;
            }
            else {
              if (*(void **)(puVar3 + 2) == (void *)0x0) {
                pvVar11 = malloc((ulong)uVar8 << 4);
              }
              else {
                pvVar11 = realloc(*(void **)(puVar3 + 2),(ulong)uVar8 << 4);
              }
              *(void **)(puVar3 + 2) = pvVar11;
              *puVar3 = uVar8 * 2;
            }
          }
          else {
            pvVar11 = *(void **)(puVar3 + 2);
          }
          uVar8 = puVar3[1];
          puVar3[1] = uVar8 + 1;
          *(long *)((long)pvVar11 + (long)(int)uVar8 * 8) = lVar16;
          lVar24 = lVar24 + 1;
          vDiffs = p->vDiffs;
        } while (lVar24 < vDiffs->nSize);
      }
      lVar16 = lVar16 + 1;
      pVVar12 = p->pNtk->vCos;
    } while (lVar16 < pVVar12->nSize);
  }
  if (fVerbose != 0) {
    lVar16 = (long)p->vSuppTargs->nSize;
    if (0 < lVar16) {
      lVar24 = 0;
      do {
        lVar24 = lVar24 + 1;
      } while (lVar16 != lVar24);
    }
    printf("Number of support targets after simulation = %5d.\n");
  }
  lVar16 = (long)p->vSuppTargs->nSize;
  if (0 < lVar16) {
    lVar24 = 0;
    iVar6 = 0;
    do {
      iVar6 = iVar6 + *(int *)((long)p->vSuppTargs->pArray[lVar24] + 4);
      lVar24 = lVar24 + 1;
    } while (lVar16 != lVar24);
    if (iVar6 != 0) {
      Sim_UtilAssignRandom(p);
      uVar8 = Sim_ComputeSuppRound(p,1);
      pVVar14 = p->vSuppTargs;
      uVar17 = (ulong)pVVar14->nSize;
      if (0 < (long)uVar17) {
        uVar20 = 0;
        iVar6 = 0;
        do {
          iVar6 = iVar6 + *(int *)((long)pVVar14->pArray[uVar20] + 4);
          uVar20 = uVar20 + 1;
        } while (uVar17 != uVar20);
        if (iVar6 != 0) {
          if (fVerbose != 0) {
            uVar20 = 0;
            uVar21 = 0;
            do {
              uVar21 = (ulong)(uint)((int)uVar21 + *(int *)((long)pVVar14->pArray[uVar20] + 4));
              uVar20 = uVar20 + 1;
            } while (uVar17 != uVar20);
            printf("Targets = %5d.   Solved = %5d.  Fifo = %5d.\n",uVar21,(ulong)uVar8,
                   (ulong)(uint)p->vFifo->nSize);
            pVVar14 = p->vSuppTargs;
            uVar17 = (ulong)(uint)pVVar14->nSize;
          }
          uVar8 = (uint)uVar17;
          while (0 < (int)uVar8) {
            uVar20 = 0;
            iVar6 = 0;
            do {
              iVar6 = iVar6 + *(int *)((long)pVVar14->pArray[uVar20] + 4);
              uVar20 = uVar20 + 1;
            } while ((uVar17 & 0xffffffff) != uVar20);
            if (iVar6 < 1) break;
            p->nSatRuns = 0;
            lVar16 = 0;
            do {
              uVar17 = (ulong)*(uint *)((long)pVVar14->pArray[lVar16] + 4);
              while( true ) {
                if ((int)uVar17 < 1) break;
                if (p->vSuppTargs->nSize <= lVar16) goto LAB_004d366a;
                pvVar11 = p->vSuppTargs->pArray[lVar16];
                if (*(int *)((long)pvVar11 + 4) < (int)uVar17) {
LAB_004d364b:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                local_88 = uVar17 - 1;
                lVar24 = *(long *)(*(long *)((long)pvVar11 + 8) + local_88 * 8);
                p->nSatRuns = p->nSatRuns + 1;
                iVar7 = (int)lVar16;
                uVar8 = (uint)lVar24;
                local_a0 = Abc_NtkMiterForCofactors(p->pNtk,uVar8,iVar7,-1);
                Fraig_ParamsSetDefault(&local_70);
                local_70.nSeconds = 1000000000;
                local_70.fInternal = 1;
                iVar6 = clock_gettime(3,&local_b0);
                if (iVar6 < 0) {
                  lVar19 = 1;
                }
                else {
                  lVar19 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_b0.tv_nsec),8);
                  lVar19 = ((lVar19 >> 7) - (lVar19 >> 0x3f)) + local_b0.tv_sec * -1000000;
                }
                p_00 = (Fraig_Man_t *)Abc_NtkToFraig(local_a0,&local_70,0,0);
                iVar6 = clock_gettime(3,&local_b0);
                if (iVar6 < 0) {
                  lVar18 = -1;
                }
                else {
                  lVar18 = local_b0.tv_nsec / 1000 + local_b0.tv_sec * 1000000;
                }
                p->timeFraig = p->timeFraig + lVar18 + lVar19;
                iVar6 = clock_gettime(3,&local_b0);
                if (iVar6 < 0) {
                  lVar19 = 1;
                }
                else {
                  lVar19 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_b0.tv_nsec),8);
                  lVar19 = ((lVar19 >> 7) - (lVar19 >> 0x3f)) + local_b0.tv_sec * -1000000;
                }
                Fraig_ManProveMiter(p_00);
                iVar6 = clock_gettime(3,&local_b0);
                if (iVar6 < 0) {
                  lVar18 = -1;
                }
                else {
                  lVar18 = local_b0.tv_nsec / 1000 + local_b0.tv_sec * 1000000;
                }
                p->timeSat = p->timeSat + lVar18 + lVar19;
                iVar6 = Fraig_ManCheckMiter(p_00);
                if (iVar6 < 0) {
                  __assert_fail("RetValue >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                                ,0x1e5,"void Sim_SolveTargetsUsingSat(Sim_Man_t *, int)");
                }
                if (iVar6 == 1) {
                  p->nSatRunsUnsat = p->nSatRunsUnsat + 1;
                  pvVar11 = p->vSuppTargs->pArray[lVar16];
                  uVar8 = *(uint *)((long)pvVar11 + 4);
                  lVar19 = (ulong)uVar8 + 1;
                  do {
                    if ((int)lVar19 + -1 < 1) {
                      __assert_fail("i >= 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                    ,0x318,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
                    }
                    lVar18 = lVar19 + -1;
                    lVar1 = lVar19 * 8;
                    lVar19 = lVar18;
                  } while (*(long *)(*(long *)((long)pvVar11 + 8) + -0x10 + lVar1) != lVar24);
                  for (; (int)lVar18 < (int)uVar8; lVar18 = lVar18 + 1) {
                    *(undefined8 *)(*(long *)((long)pvVar11 + 8) + -8 + lVar18 * 8) =
                         *(undefined8 *)(*(long *)((long)pvVar11 + 8) + lVar18 * 8);
                  }
                  *(uint *)((long)pvVar11 + 4) = uVar8 - 1;
                  iVar6 = 1;
                }
                else {
                  p->nSatRunsSat = p->nSatRunsSat + 1;
                  local_98 = (void **)Fraig_ManReadModel(p_00);
                  if (local_98 == (void **)0x0) {
                    __assert_fail("pModel != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                                  ,0x1f0,"void Sim_SolveTargetsUsingSat(Sim_Man_t *, int)");
                  }
                  pAVar22 = p->pNtk;
                  if ((pAVar22->vTravIds).pArray == (int *)0x0) {
                    iVar15 = pAVar22->vObjs->nSize;
                    uVar17 = (long)iVar15 + 500;
                    iVar23 = (int)uVar17;
                    if ((pAVar22->vTravIds).nCap < iVar23) {
                      __s = (int *)malloc(uVar17 * 4);
                      (pAVar22->vTravIds).pArray = __s;
                      if (__s == (int *)0x0) {
                        __assert_fail("p->pArray",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                      }
                      (pAVar22->vTravIds).nCap = iVar23;
                    }
                    else {
                      __s = (int *)0x0;
                    }
                    if (-500 < iVar15) {
                      memset(__s,0,(uVar17 & 0xffffffff) << 2);
                    }
                    (pAVar22->vTravIds).nSize = iVar23;
                  }
                  local_90 = CONCAT44(local_90._4_4_,iVar6);
                  iVar6 = pAVar22->nTravIds;
                  pAVar22->nTravIds = iVar6 + 1;
                  if (0x3ffffffe < iVar6) {
                    __assert_fail("p->nTravIds < (1<<30)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
                  }
                  pVVar12 = pAVar22->vCis;
                  if (0 < pVVar12->nSize) {
                    lVar24 = 0;
                    do {
                      plVar4 = (long *)pVVar12->pArray[lVar24];
                      lVar19 = *plVar4;
                      iVar6 = (int)plVar4[2];
                      uVar2 = *(undefined4 *)(lVar19 + 0xd8);
                      Vec_IntFillExtra((Vec_Int_t *)(lVar19 + 0xe0),iVar6 + 1,(int)pAVar22);
                      if (((long)iVar6 < 0) || (*(int *)(lVar19 + 0xe4) <= iVar6)) {
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                      }
                      *(undefined4 *)(*(long *)(lVar19 + 0xe8) + (long)iVar6 * 4) = uVar2;
                      if (pAVar22->vCis->nSize <= lVar16) goto LAB_004d364b;
                      if (plVar4 == (long *)pAVar22->vCis->pArray[lVar16]) {
                        plVar4[8] = 1;
                      }
                      else if (*(int *)((long)local_98 + lVar24 * 4) == 1) {
                        plVar4[8] = 3;
                      }
                      else {
                        plVar4[8] = 0;
                      }
                      lVar24 = lVar24 + 1;
                      pVVar12 = pAVar22->vCis;
                    } while (lVar24 < pVVar12->nSize);
                  }
                  if (((int)uVar8 < 0) || (pAVar22->vCos->nSize <= (int)uVar8)) goto LAB_004d364b;
                  plVar4 = (long *)pAVar22->vCos->pArray[uVar8 & 0x7fffffff];
                  uVar9 = Sim_NtkSimTwoPats_rec
                                    (*(Abc_Obj_t **)
                                      (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                      (long)*(int *)plVar4[4] * 8));
                  iVar6 = (int)local_90;
                  if ((uVar9 & 3) - 3 < 0xfffffffe) {
                    __assert_fail("Sim_SolveSuppModelVerify( p->pNtk, pModel, Input, Output )",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                                  ,0x1f1,"void Sim_SolveTargetsUsingSat(Sim_Man_t *, int)");
                  }
                  pSVar13 = Sim_ManPatAlloc(p);
                  pSVar13->Input = iVar7;
                  pSVar13->Output = uVar8;
                  pVVar12 = p->pNtk->vCis;
                  iVar15 = pVVar12->nSize;
                  if (0 < iVar15) {
                    uVar17 = 0;
                    do {
                      if (*(int *)((long)local_98 + uVar17 * 4) != 0) {
                        pSVar13->pData[uVar17 >> 5 & 0x7ffffff] =
                             pSVar13->pData[uVar17 >> 5 & 0x7ffffff] | 1 << ((byte)uVar17 & 0x1f);
                        iVar15 = pVVar12->nSize;
                      }
                      uVar17 = uVar17 + 1;
                    } while ((long)uVar17 < (long)iVar15);
                  }
                  pVVar12 = p->vFifo;
                  uVar8 = pVVar12->nSize;
                  if (uVar8 == pVVar12->nCap) {
                    if ((int)uVar8 < 0x10) {
                      if (pVVar12->pArray == (void **)0x0) {
                        ppvVar10 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar10 = (void **)realloc(pVVar12->pArray,0x80);
                      }
                      pVVar12->pArray = ppvVar10;
                      pVVar12->nCap = 0x10;
                    }
                    else {
                      if (pVVar12->pArray == (void **)0x0) {
                        ppvVar10 = (void **)malloc((ulong)uVar8 << 4);
                      }
                      else {
                        ppvVar10 = (void **)realloc(pVVar12->pArray,(ulong)uVar8 << 4);
                      }
                      pVVar12->pArray = ppvVar10;
                      pVVar12->nCap = uVar8 * 2;
                    }
                  }
                  else {
                    ppvVar10 = pVVar12->pArray;
                  }
                  iVar15 = pVVar12->nSize;
                  pVVar12->nSize = iVar15 + 1;
                  ppvVar10[iVar15] = pSVar13;
                }
                Fraig_ManFree(p_00);
                Abc_NtkDelete(local_a0);
                p->iInput = iVar7;
                uVar17 = local_88;
                if (iVar6 != 1) goto LAB_004d33ee;
              }
              lVar16 = lVar16 + 1;
              pVVar14 = p->vSuppTargs;
            } while (lVar16 < pVVar14->nSize);
LAB_004d33ee:
            uVar8 = 0;
            do {
              pVVar12 = p->vFifo;
              if (pVVar12->nSize < 1) break;
              uVar9 = pVVar12->nSize - 1;
              pVVar12->nSize = uVar9;
              local_78 = (Sim_Pat_t *)pVVar12->pArray[uVar9];
              uVar9 = p->nSuppWords + uVar8;
              if (p->nSimWords <= (int)uVar9) {
                uVar9 = p->nSimWords;
              }
              pVVar12 = p->pNtk->vCis;
              if (0 < pVVar12->nSize) {
                ppvVar10 = pVVar12->pArray;
                ppvVar5 = p->vSim0->pArray;
                pAVar22 = (Abc_Ntk_t *)local_78->pData;
                local_88 = (long)(int)uVar8 * 4;
                local_90 = (ulong)(~uVar8 + uVar9) * 4 + 4;
                uVar17 = 0;
                local_a0 = pAVar22;
                local_98 = ppvVar10;
                do {
                  pvVar11 = ppvVar5[*(int *)((long)ppvVar10[uVar17] + 0x10)];
                  uVar20 = uVar17 >> 5 & 0x7ffffff;
                  if (((uint)pAVar22->nObjCounts[uVar20 - 0x18] >> ((uint)uVar17 & 0x1f) & 1) == 0)
                  {
                    if ((int)uVar8 < (int)uVar9) {
                      iVar6 = 0;
                      goto LAB_004d34d7;
                    }
                  }
                  else if ((int)uVar8 < (int)uVar9) {
                    iVar6 = 0xff;
LAB_004d34d7:
                    memset((void *)((long)pvVar11 + local_88),iVar6,local_90);
                    ppvVar10 = local_98;
                    pAVar22 = local_a0;
                  }
                  puVar3 = (uint *)((long)pvVar11 + uVar20 * 4 + (long)(int)uVar8 * 4);
                  *puVar3 = *puVar3 ^ 1 << ((byte)uVar17 & 0x1f);
                  uVar17 = uVar17 + 1;
                } while ((long)uVar17 < (long)pVVar12->nSize);
              }
              Sim_ManPatFree(p,local_78);
              uVar8 = uVar9;
            } while (uVar9 != p->nSimWords);
            uVar8 = Sim_ComputeSuppRound(p,1);
            if (fVerbose != 0) {
              lVar16 = (long)p->vSuppTargs->nSize;
              if (lVar16 < 1) {
                uVar17 = 0;
              }
              else {
                lVar24 = 0;
                uVar17 = 0;
                do {
                  uVar17 = (ulong)(uint)((int)uVar17 +
                                        *(int *)((long)p->vSuppTargs->pArray[lVar24] + 4));
                  lVar24 = lVar24 + 1;
                } while (lVar16 != lVar24);
              }
              printf("Targets = %5d.   Solved = %5d.  Fifo = %5d.  SAT runs = %3d.\n",uVar17,
                     (ulong)uVar8,(ulong)(uint)p->vFifo->nSize,(ulong)(uint)p->nSatRuns);
            }
            pVVar14 = p->vSuppTargs;
            uVar8 = pVVar14->nSize;
            uVar17 = (ulong)uVar8;
          }
        }
      }
    }
  }
  iVar6 = clock_gettime(3,(timespec *)&local_70);
  if (iVar6 < 0) {
    lVar16 = -1;
  }
  else {
    lVar16 = CONCAT44(local_70.nSeconds,local_70.nBTLimit) / 1000 + local_70._0_8_ * 1000000;
  }
  p->timeTotal = lVar16 + local_80;
  pVVar12 = p->vSuppFun;
  Sim_ManStop(p);
  return pVVar12;
}

Assistant:

Vec_Ptr_t * Sim_ComputeFunSupp( Abc_Ntk_t * pNtk, int fVerbose )
{
    Sim_Man_t * p;
    Vec_Ptr_t * vResult;
    int nSolved, i;
    abctime clk = Abc_Clock();

    srand( 0xABC );

    // start the simulation manager
    p = Sim_ManStart( pNtk, 0 );

    // compute functional support using one round of random simulation
    Sim_UtilAssignRandom( p );
    Sim_ComputeSuppRound( p, 0 );

    // set the support targets 
    Sim_ComputeSuppSetTargets( p );
    if ( fVerbose )
        printf( "Number of support targets after simulation = %5d.\n", Vec_VecSizeSize(p->vSuppTargs) );
    if ( Vec_VecSizeSize(p->vSuppTargs) == 0 )
        goto exit;

    for ( i = 0; i < 1; i++ )
    {
        // compute patterns using one round of random simulation
        Sim_UtilAssignRandom( p );
        nSolved = Sim_ComputeSuppRound( p, 1 );
        if ( Vec_VecSizeSize(p->vSuppTargs) == 0 )
            goto exit;

        if ( fVerbose )
            printf( "Targets = %5d.   Solved = %5d.  Fifo = %5d.\n",
                Vec_VecSizeSize(p->vSuppTargs), nSolved, Vec_PtrSize(p->vFifo) );
    }

    // try to solve the support targets
    while ( Vec_VecSizeSize(p->vSuppTargs) > 0 )
    {
        // solve targets until the first disproved one (which gives counter-example)
        Sim_SolveTargetsUsingSat( p, p->nSimWords/p->nSuppWords );
        // compute additional functional support
        Sim_UtilAssignFromFifo( p );
        nSolved = Sim_ComputeSuppRound( p, 1 );

if ( fVerbose )
    printf( "Targets = %5d.   Solved = %5d.  Fifo = %5d.  SAT runs = %3d.\n", 
            Vec_VecSizeSize(p->vSuppTargs), nSolved, Vec_PtrSize(p->vFifo), p->nSatRuns );
    }

exit:
p->timeTotal = Abc_Clock() - clk;
    vResult = p->vSuppFun;  
    //  p->vSuppFun = NULL;
    Sim_ManStop( p );
    return vResult;
}